

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::addDeclaration(XmlOutput *this,QString *version,QString *encoding)

{
  XMLState XVar1;
  char *pcVar2;
  QMessageLogger *in_RDX;
  QString *in_RSI;
  XmlOutput *in_RDI;
  long in_FS_OFFSET;
  QString outData;
  QList<QString> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  int fieldWidth;
  XmlOutput *this_00;
  QChar local_c2 [5];
  char *in_stack_ffffffffffffff48;
  QString *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  QChar in_stack_ffffffffffffff5e;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  XVar1 = in_RDI->currentState;
  if ((XVar1 == Bare) || (1 < XVar1 - Tag)) {
    this_00 = in_RDI;
    QString::QString((QString *)CONCAT44(XVar1,in_stack_ffffffffffffff18),in_stack_ffffffffffffff48)
    ;
    fieldWidth = (int)((ulong)in_RDX >> 0x20);
    doConversion((XmlOutput *)CONCAT26(in_stack_ffffffffffffff5e.ucs,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff5e,L' ');
    QString::arg<QString,_true>((QString *)this_00,in_RSI,fieldWidth,in_stack_ffffffffffffff5e);
    doConversion((XmlOutput *)CONCAT26(in_stack_ffffffffffffff5e.ucs,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
    QChar::QChar<char16_t,_true>(local_c2,L' ');
    QString::arg<QString,_true>((QString *)this_00,in_RSI,fieldWidth,in_stack_ffffffffffffff5e);
    QString::~QString((QString *)0x2c213c);
    QString::~QString((QString *)0x2c2149);
    QString::~QString((QString *)0x2c2153);
    QString::~QString((QString *)0x2c215d);
    addRaw(in_RDI,(QString *)in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x2c217c);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)CONCAT44(XVar1,in_stack_ffffffffffffff18),(int)((ulong)in_RDI >> 0x20)
               ,(char *)in_stack_ffffffffffffff08);
    QList<QString>::last(in_stack_ffffffffffffff08);
    QString::toLatin1((QString *)in_stack_ffffffffffffff08);
    pcVar2 = QByteArray::constData((QByteArray *)0x2c2042);
    QMessageLogger::debug(local_28,"<%s>: Cannot add declaration when not in bare state",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x2c2068);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void XmlOutput::addDeclaration(const QString &version, const QString &encoding)
{
    switch(currentState) {
        case Bare:
            break;
        case Tag:
        case Attribute:
            //warn_msg(WarnLogic, "<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            return;
    }
    QString outData = QString("<?xml version=\"%1\" encoding=\"%2\"?>")
                              .arg(doConversion(version))
                              .arg(doConversion(encoding));
    addRaw(outData);
}